

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O3

cell * __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::tag_data
          (cell *__return_storage_ptr__,quasiquote_conversion_visitor *this,cell *c)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  bool bVar3;
  cell *extraout_RAX;
  cell *extraout_RAX_00;
  cell *pcVar4;
  
  pcVar4 = (cell *)this;
  bVar3 = tag_is_backquote(this,(cell *)this);
  if (!bVar3) {
    bVar3 = tag_is_comma(this,pcVar4);
    if (!bVar3) {
      bVar3 = tag_is_comma_atsign(this,pcVar4);
      if (!bVar3) {
        __assert_fail("tag_is_backquote(c) || tag_is_comma(c) || tag_is_comma_atsign(c)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quasiquote_conversion.cpp"
                      ,0x41,
                      "cell skiwi::(anonymous namespace)::quasiquote_conversion_visitor::tag_data(const cell &)"
                     );
      }
    }
  }
  pp_Var1 = this[5].super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
            _vptr_base_visitor;
  if (pp_Var1[2] < (_func_int *)0x4) {
    __return_storage_ptr__->type = *(cell_type *)(pp_Var1 + 0xb);
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->value,pp_Var1[0xc],
               pp_Var1[0xd] + (long)pp_Var1[0xc]);
    std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::vector
              (&__return_storage_ptr__->pair,
               (vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)(pp_Var1 + 0x10));
    std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::vector
              (&__return_storage_ptr__->vec,
               (vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)(pp_Var1 + 0x13));
    pcVar4 = extraout_RAX_00;
  }
  else {
    bVar3 = operator==((cell *)(pp_Var1[0x10] + 0x58),(cell *)skiwi::nil_sym);
    if (!bVar3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quasiquote_conversion.cpp"
                    ,0x47,
                    "cell skiwi::(anonymous namespace)::quasiquote_conversion_visitor::tag_data(const cell &)"
                   );
    }
    p_Var2 = this[5].super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>
             ._vptr_base_visitor[0x10];
    __return_storage_ptr__->type = *(cell_type *)p_Var2;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->value,*(long *)(p_Var2 + 8),
               *(long *)(p_Var2 + 0x10) + *(long *)(p_Var2 + 8));
    std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::vector
              (&__return_storage_ptr__->pair,
               (vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)(p_Var2 + 0x28));
    std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::vector
              (&__return_storage_ptr__->vec,
               (vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)(p_Var2 + 0x40));
    pcVar4 = extraout_RAX;
  }
  return pcVar4;
}

Assistant:

cell tag_data(const cell& c)
      {
      assert(tag_is_backquote(c) || tag_is_comma(c) || tag_is_comma_atsign(c));
      if (c.pair[0].value.length() > 3) // quasiquote, unquote, or unquote-splicing
        {
        if (c.pair[1].pair[1] == nil_sym)
          return c.pair[1].pair[0];
        else
          assert(0);
        }
      return c.pair[1];
      }